

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O2

_Bool ggml_backend_cpu_device_supports_buft(ggml_backend_dev_t dev,ggml_backend_buffer_type_t buft)

{
  ggml_backend_buffer_type *pgVar1;
  char cVar2;
  bool bVar3;
  pointer ppgVar4;
  
  cVar2 = ggml_backend_buft_is_host(buft);
  bVar3 = true;
  if (cVar2 == '\0') {
    ggml_backend_cpu_get_extra_buffers_type();
    ppgVar4 = ggml_backend_cpu_get_extra_buffers_type::bufts.
              super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar3 = ppgVar4 !=
              ggml_backend_cpu_get_extra_buffers_type::bufts.
              super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (ppgVar4 ==
          ggml_backend_cpu_get_extra_buffers_type::bufts.
          super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return bVar3;
      }
      pgVar1 = *ppgVar4;
      ppgVar4 = ppgVar4 + 1;
    } while (pgVar1 != buft || pgVar1 == (ggml_backend_buffer_type *)0x0);
  }
  return bVar3;
}

Assistant:

static bool ggml_backend_cpu_device_supports_buft(ggml_backend_dev_t dev, ggml_backend_buffer_type_t buft) {
    return ggml_backend_buft_is_host(buft) || ggml_backend_cpu_is_extra_buffer_type(buft);
    GGML_UNUSED(dev);
}